

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O0

short __thiscall C3DFile::getParamGeneric<short>(C3DFile *this,char *id_str,short default_value)

{
  bool bVar1;
  ostream *poVar2;
  int local_d8;
  int i;
  ParameterInfo local_c8;
  undefined1 local_78 [8];
  ParameterInfo param_info;
  short default_value_local;
  char *id_str_local;
  C3DFile *this_local;
  
  param_info._78_2_ = default_value;
  ParameterInfo::ParameterInfo((ParameterInfo *)local_78);
  getParamInfo(&local_c8,this,id_str);
  ParameterInfo::operator=((ParameterInfo *)local_78,&local_c8);
  ParameterInfo::~ParameterInfo(&local_c8);
  if (param_info.name._3_1_ == 0) {
    bVar1 = check_param_type<short>(param_info.name._2_1_);
    if (!bVar1) {
      __assert_fail("check_param_type<T>(param_info.data_type)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                    ,0x1e2,"T C3DFile::getParamGeneric(const char *, T) [T = short]");
    }
    if ((param_info.name._2_1_ == '\x01') || (param_info.name._2_1_ == -1)) {
      this_local._6_2_ = (short)(char)*param_info.dimensions;
    }
    else if (param_info.name._2_1_ == '\x02') {
      this_local._6_2_ = *(short *)param_info.char_data;
    }
    else if (param_info.name._2_1_ == '\x04') {
      this_local._6_2_ = (short)(int)*(float *)param_info.int_data;
    }
    else {
      this_local._6_2_ = param_info._78_2_;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Invalid query for parameter ");
    poVar2 = std::operator<<(poVar2,id_str);
    std::operator<<(poVar2,": parameter is multidimensional (dim = ");
    std::ostream::operator<<((ostream *)&std::cerr,(uint)*(byte *)param_info._16_8_);
    for (local_d8 = 1; local_d8 < (int)(uint)param_info.name._3_1_; local_d8 = local_d8 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,", ");
      std::ostream::operator<<(poVar2,(uint)*(byte *)(param_info._16_8_ + (long)local_d8));
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,").");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._6_2_ = 0;
  }
  ParameterInfo::~ParameterInfo((ParameterInfo *)local_78);
  return this_local._6_2_;
}

Assistant:

T C3DFile::getParamGeneric(const char* id_str, T default_value) {
	ParameterInfo param_info;

	param_info = getParamInfo(id_str);

	/*
	std::cout << "param_info.data_type    = " << static_cast<int>(param_info.data_type) << std::endl;
	std::cout << "param_info.n_dimensions = " << static_cast<int>(param_info.n_dimensions) << std::endl;
	std::cout << "param_info.n_dimensions = " << static_cast<int>(param_info.dimensions[0]) << std::endl;
	*/

	if (param_info.n_dimensions != 0 ||
			(param_info.n_dimensions == 1 && param_info.dimensions[0] != 1)) {
		std::cerr << "Invalid query for parameter " << id_str << ": parameter is multidimensional (dim = ";

		int i;
		std::cerr << static_cast<int>(param_info.dimensions[0]);
		for (i = 1; i < param_info.n_dimensions; i++) {
			std::cerr << ", " << static_cast<int>(param_info.dimensions[i]);
		}
		std::cerr << ")." << std::endl;
		return 0;
	}

	assert (param_info.n_dimensions == 0 ||
			(param_info.n_dimensions == 1 && param_info.dimensions[0] == 1));
	assert (check_param_type<T>(param_info.data_type));

	if (param_info.data_type == 1 || param_info.data_type == -1)
		return param_info.char_data[0];
	if (param_info.data_type == 2)
		return param_info.int_data[0];
	if (param_info.data_type == 4)
		return param_info.float_data[0];

	return default_value;
}